

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log::~Log(Log *this)

{
  char *buff;
  LogFile *this_00;
  LogMessage *pLVar1;
  
  pLVar1 = LogMessage::operator<<(&this->log_message,"     [FileName:");
  pLVar1 = LogMessage::operator<<(pLVar1,&this->filename);
  pLVar1 = LogMessage::operator<<(pLVar1," ");
  pLVar1 = LogMessage::operator<<(pLVar1,"Line:");
  pLVar1 = LogMessage::operator<<(pLVar1,this->line);
  LogMessage::operator<<(pLVar1,"]\n");
  this_00 = log_file;
  if (log_file != (LogFile *)0x0) {
    buff = (this->log_message).message;
    (this->log_message).message = (char *)0x0;
    LogFile::put_write_string(this_00,buff);
  }
  std::__cxx11::string::~string((string *)&this->filename);
  LogMessage::~LogMessage(&this->log_message);
  return;
}

Assistant:

Log::~Log()
{
    log_message<<"     [FileName:"<<filename<<" "<<"Line:"<<line<<"]\n";
    if(log_file != nullptr)
    {
        log_file->put_write_string(log_message.GetMessage());
    }
}